

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzysmp.cpp
# Opt level: O0

void __thiscall
TPZFYsmpMatrix<std::complex<double>_>::AddKel
          (TPZFYsmpMatrix<std::complex<double>_> *this,TPZFMatrix<std::complex<double>_> *elmat,
          TPZVec<long> *destinationindex)

{
  complex<double> *pcVar1;
  complex<double> a;
  bool bVar2;
  int64_t iVar3;
  long *plVar4;
  long lVar5;
  complex<double> *pcVar6;
  ostream *poVar7;
  void *this_00;
  TPZVec<long> *in_RDX;
  TPZBaseMatrix *in_RSI;
  long in_RDI;
  undefined8 extraout_XMM0_Qa;
  undefined8 uVar8;
  int flag;
  int64_t jpos;
  int64_t ipos;
  complex<double> value;
  int64_t k;
  int64_t j;
  int64_t i;
  complex<double> *in_stack_ffffffffffffff48;
  complex<double> *in_stack_ffffffffffffff50;
  long in_stack_ffffffffffffff58;
  long in_stack_ffffffffffffff60;
  complex<double> local_40;
  long local_30;
  long local_28;
  long local_20;
  TPZVec<long> *local_18;
  TPZBaseMatrix *local_10;
  
  local_30 = 0;
  uVar8 = 0;
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::complex<double>::complex(&local_40,0.0,0.0);
  local_20 = 0;
  do {
    lVar5 = local_20;
    iVar3 = TPZBaseMatrix::Rows(local_10);
    if (iVar3 <= lVar5) {
      return;
    }
    for (local_28 = 0; lVar5 = local_28, iVar3 = TPZBaseMatrix::Rows(local_10), lVar5 < iVar3;
        local_28 = local_28 + 1) {
      plVar4 = TPZVec<long>::operator[](local_18,local_20);
      iVar3 = *plVar4;
      plVar4 = TPZVec<long>::operator[](local_18,local_28);
      pcVar1 = (complex<double> *)*plVar4;
      (*(local_10->super_TPZSavable)._vptr_TPZSavable[0x24])(local_10,local_20,local_28);
      a._M_value._8_8_ = in_stack_ffffffffffffff60;
      a._M_value._0_8_ = in_stack_ffffffffffffff58;
      local_40._M_value._0_8_ = extraout_XMM0_Qa;
      local_40._M_value._8_8_ = uVar8;
      bVar2 = IsZero(a);
      if (!bVar2) {
        bVar2 = false;
        lVar5 = local_30 + 1;
        local_30 = lVar5;
        plVar4 = TPZVec<long>::operator[]((TPZVec<long> *)(in_RDI + 0x20),iVar3);
        if (((lVar5 < *plVar4) ||
            (in_stack_ffffffffffffff60 = local_30,
            plVar4 = TPZVec<long>::operator[]((TPZVec<long> *)(in_RDI + 0x20),iVar3 + 1),
            *plVar4 <= in_stack_ffffffffffffff60)) ||
           (plVar4 = TPZVec<long>::operator[]((TPZVec<long> *)(in_RDI + 0x40),local_30),
           (complex<double> *)*plVar4 != pcVar1)) {
          plVar4 = TPZVec<long>::operator[]((TPZVec<long> *)(in_RDI + 0x20),iVar3);
          local_30 = *plVar4;
          while (in_stack_ffffffffffffff58 = local_30,
                plVar4 = TPZVec<long>::operator[]((TPZVec<long> *)(in_RDI + 0x20),iVar3 + 1),
                in_stack_ffffffffffffff58 < *plVar4) {
            plVar4 = TPZVec<long>::operator[]((TPZVec<long> *)(in_RDI + 0x40),local_30);
            if (((complex<double> *)*plVar4 == pcVar1) ||
               (plVar4 = TPZVec<long>::operator[]((TPZVec<long> *)(in_RDI + 0x40),local_30),
               *plVar4 == -1)) {
              bVar2 = true;
              plVar4 = TPZVec<long>::operator[]((TPZVec<long> *)(in_RDI + 0x40),local_30);
              if (*plVar4 == -1) {
                in_stack_ffffffffffffff50 = pcVar1;
                plVar4 = TPZVec<long>::operator[]((TPZVec<long> *)(in_RDI + 0x40),local_30);
                *plVar4 = (long)in_stack_ffffffffffffff50;
                pcVar6 = TPZVec<std::complex<double>_>::operator[]
                                   ((TPZVec<std::complex<double>_> *)(in_RDI + 0x60),local_30);
                *(undefined8 *)pcVar6->_M_value = local_40._M_value._0_8_;
                *(undefined8 *)(pcVar6->_M_value + 8) = local_40._M_value._8_8_;
              }
              else {
                TPZVec<std::complex<double>_>::operator[]
                          ((TPZVec<std::complex<double>_> *)(in_RDI + 0x60),local_30);
                std::complex<double>::operator+=
                          (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
              }
              break;
            }
            local_30 = local_30 + 1;
          }
        }
        else {
          TPZVec<std::complex<double>_>::operator[]
                    ((TPZVec<std::complex<double>_> *)(in_RDI + 0x60),local_30);
          std::complex<double>::operator+=(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
          bVar2 = true;
        }
        if (!bVar2) {
          poVar7 = std::operator<<((ostream *)&std::cout,
                                   "TPZFYsmpMatrix::AddKel: Non existing position on sparse matrix: line ="
                                  );
          poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar3);
          poVar7 = std::operator<<(poVar7," column =");
          this_00 = (void *)std::ostream::operator<<(poVar7,(long)pcVar1);
          std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
        }
      }
    }
    local_20 = local_20 + 1;
  } while( true );
}

Assistant:

void TPZFYsmpMatrix<TVar>::AddKel(TPZFMatrix<TVar> & elmat, TPZVec<int64_t> & destinationindex){
    int64_t i,j,k = 0;
    TVar value=0.;
    int64_t ipos,jpos;
    for(i=0;i<elmat.Rows();i++){
        for(j=0;j<elmat.Rows();j++){
            ipos=destinationindex[i];
            jpos=destinationindex[j];
            value=elmat.GetVal(i,j);
            //cout << "j= " << j << endl;
            if(!IsZero(value)){
                //cout << "fIA[ipos] " << fIA[ipos] << "     fIA[ipos+1] " << fIA[ipos+1] << endl;
                int flag = 0;
				k++;
				if(k >= fIA[ipos] && k < fIA[ipos+1] && fJA[k]==jpos)
				{ // OK -> elements in sequence
					fA[k]+=value;
					flag = 1;
				}else
				{
					for(k=fIA[ipos];k<fIA[ipos+1];k++){
						if(fJA[k]==jpos || fJA[k]==-1){
							//cout << "fJA[k] " << fJA[k] << " jpos "<< jpos << "   " << value << endl;
							//cout << "k " << k << "   "<< jpos << "   " << value << endl;
							flag=1;
							if(fJA[k]==-1){
								fJA[k]=jpos;
								fA[k]=value;
								// cout << jpos << "   " << value << endl;
								break;
							}else{
								fA[k]+=value;
								break;
							}
						}
					}
				}
                if(!flag) cout << "TPZFYsmpMatrix::AddKel: Non existing position on sparse matrix: line =" << ipos << " column =" << jpos << endl;         }
        }
    }
}